

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

double __thiscall Model::schoenberg_kernel(Model *this,int contextId,int centerId,double sigma)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  double dVar4;
  uint local_40;
  uint local_3c;
  int d_1;
  int d;
  double *diff;
  double sum;
  double inv;
  double sigma_local;
  int centerId_local;
  int contextId_local;
  Model *this_local;
  
  auVar1 = ZEXT416(this->dim_size) * ZEXT816(8);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  for (local_3c = 0; local_3c < this->dim_size; local_3c = local_3c + 1) {
    *(double *)((long)pvVar3 + (long)(int)local_3c * 8) =
         this->emb1[contextId][(int)local_3c] - this->emb0[centerId][(int)local_3c];
  }
  diff = (double *)0x0;
  for (local_40 = 0; local_40 < this->dim_size; local_40 = local_40 + 1) {
    diff = (double *)
           (*(double *)((long)pvVar3 + (long)(int)local_40 * 8) *
            *(double *)((long)pvVar3 + (long)(int)local_40 * 8) + (double)diff);
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  dVar4 = pow(1.0 / ((double)diff + 1.0),sigma);
  return dVar4;
}

Assistant:

double Model::schoenberg_kernel(int contextId, int centerId, double sigma) {

    double inv, sum;
    auto *diff = new double[this->dim_size];

    for (int d = 0; d < this->dim_size; d++)
        diff[d] = this->emb1[contextId][d] - this->emb0[centerId][d];

    sum = 0.0;
    for(int d = 0; d < this->dim_size; d++)
        sum += diff[d] * diff[d];
    inv = 1.0 / ( 1.0 + sum );

    delete [] diff;

    return pow(inv, sigma);
}